

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

string * __thiscall
soul::StructuralParser::parseAnnotationKey_abi_cxx11_
          (string *__return_storage_ptr__,StructuralParser *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  bVar2 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
          ::matchesAny<soul::TokenType,soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                      *)this,(TokenType)0x259dc6,(TokenType)0x259f54);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->super_SOULTokeniser).currentStringValue._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (this->super_SOULTokeniser).currentStringValue._M_string_length);
    return __return_storage_ptr__;
  }
  pcVar4 = (this->super_SOULTokeniser).currentType.text;
  if (pcVar4 == "if") {
LAB_001dd357:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "if";
    pcVar4 = "";
  }
  else {
    if (pcVar4 == (char *)0x0) goto LAB_001ddae7;
    if (*pcVar4 == 'i') {
      if ((pcVar4[1] == 'f') && (pcVar4[2] == '\0')) goto LAB_001dd357;
      if (pcVar4 != "do") goto LAB_001dd397;
    }
    else if ((pcVar4 != "do") && (((*pcVar4 != 'd' || (pcVar4[1] != 'o')) || (pcVar4[2] != '\0'))))
    {
LAB_001dd397:
      if ((pcVar4 == "for") || (iVar3 = strcmp(pcVar4,"for"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "for";
        pcVar4 = "";
      }
      else if ((pcVar4 == "let") || (iVar3 = strcmp(pcVar4,"let"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "let";
        pcVar4 = "";
      }
      else if ((pcVar4 == "var") || (iVar3 = strcmp(pcVar4,"var"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "var";
        pcVar4 = "";
      }
      else if ((pcVar4 == "int") || (iVar3 = strcmp(pcVar4,"int"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "int";
        pcVar4 = "";
      }
      else if ((pcVar4 == "try") || (iVar3 = strcmp(pcVar4,"try"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "try";
        pcVar4 = "";
      }
      else if ((pcVar4 == "else") || (iVar3 = strcmp(pcVar4,"else"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "else";
        pcVar4 = "";
      }
      else if ((pcVar4 == "bool") || (iVar3 = strcmp(pcVar4,"bool"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "bool";
        pcVar4 = "";
      }
      else if ((pcVar4 == "true") || (iVar3 = strcmp(pcVar4,"true"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "true";
        pcVar4 = "";
      }
      else if ((pcVar4 == "case") || (iVar3 = strcmp(pcVar4,"case"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "case";
        pcVar4 = "";
      }
      else if ((pcVar4 == "enum") || (iVar3 = strcmp(pcVar4,"enum"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "enum";
        pcVar4 = "";
      }
      else if ((pcVar4 == "loop") || (iVar3 = strcmp(pcVar4,"loop"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "loop";
        pcVar4 = "";
      }
      else if ((pcVar4 == "void") || (iVar3 = strcmp(pcVar4,"void"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "void";
        pcVar4 = "";
      }
      else if ((pcVar4 == "while") || (iVar3 = strcmp(pcVar4,"while"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "while";
        pcVar4 = "";
      }
      else if ((pcVar4 == "break") || (iVar3 = strcmp(pcVar4,"break"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "break";
        pcVar4 = "";
      }
      else if ((pcVar4 == "const") || (iVar3 = strcmp(pcVar4,"const"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "const";
        pcVar4 = "";
      }
      else if ((pcVar4 == "int32") || (iVar3 = strcmp(pcVar4,"int32"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "int32";
        pcVar4 = "";
      }
      else if ((pcVar4 == "int64") || (iVar3 = strcmp(pcVar4,"int64"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "int64";
        pcVar4 = "";
      }
      else if ((pcVar4 == "float") || (iVar3 = strcmp(pcVar4,"float"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "float";
        pcVar4 = "";
      }
      else if ((pcVar4 == "false") || (iVar3 = strcmp(pcVar4,"false"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "false";
        pcVar4 = "";
      }
      else if ((pcVar4 == "using") || (iVar3 = strcmp(pcVar4,"using"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "using";
        pcVar4 = "";
      }
      else if ((pcVar4 == "fixed") || (iVar3 = strcmp(pcVar4,"fixed"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "fixed";
        pcVar4 = "";
      }
      else if ((pcVar4 == "graph") || (iVar3 = strcmp(pcVar4,"graph"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "graph";
        pcVar4 = "";
      }
      else if ((pcVar4 == "input") || (iVar3 = strcmp(pcVar4,"input"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "input";
        pcVar4 = "";
      }
      else if ((pcVar4 == "event") || (iVar3 = strcmp(pcVar4,"event"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "event";
        pcVar4 = "";
      }
      else if ((pcVar4 == "class") || (iVar3 = strcmp(pcVar4,"class"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "class";
        pcVar4 = "";
      }
      else if ((pcVar4 == "catch") || (iVar3 = strcmp(pcVar4,"catch"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "catch";
        pcVar4 = "";
      }
      else if ((pcVar4 == "throw") || (iVar3 = strcmp(pcVar4,"throw"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "throw";
        pcVar4 = "";
      }
      else if ((pcVar4 == "output") || (iVar3 = strcmp(pcVar4,"output"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "output";
        pcVar4 = "";
      }
      else if ((pcVar4 == "return") || (iVar3 = strcmp(pcVar4,"return"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "return";
        pcVar4 = "";
      }
      else if ((pcVar4 == "string") || (iVar3 = strcmp(pcVar4,"string"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "string";
        pcVar4 = "";
      }
      else if ((pcVar4 == "struct") || (iVar3 = strcmp(pcVar4,"struct"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "struct";
        pcVar4 = "";
      }
      else if ((pcVar4 == "import") || (iVar3 = strcmp(pcVar4,"import"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "import";
        pcVar4 = "";
      }
      else if ((pcVar4 == "switch") || (iVar3 = strcmp(pcVar4,"switch"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "switch";
        pcVar4 = "";
      }
      else if ((pcVar4 == "public") || (iVar3 = strcmp(pcVar4,"public"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "public";
        pcVar4 = "";
      }
      else if ((pcVar4 == "double") || (iVar3 = strcmp(pcVar4,"double"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "double";
        pcVar4 = "";
      }
      else if ((pcVar4 == "private") || (iVar3 = strcmp(pcVar4,"private"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "private";
        pcVar4 = "";
      }
      else if ((pcVar4 == "float32") || (iVar3 = strcmp(pcVar4,"float32"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "float32";
        pcVar4 = "";
      }
      else if ((pcVar4 == "float64") || (iVar3 = strcmp(pcVar4,"float64"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "float64";
        pcVar4 = "";
      }
      else if ((pcVar4 == "default") || (iVar3 = strcmp(pcVar4,"default"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "default";
        pcVar4 = "";
      }
      else if ((pcVar4 == "complex") || (iVar3 = strcmp(pcVar4,"complex"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "complex";
        pcVar4 = "";
      }
      else if ((pcVar4 == "continue") || (iVar3 = strcmp(pcVar4,"continue"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "continue";
        pcVar4 = "";
      }
      else if ((pcVar4 == "external") || (iVar3 = strcmp(pcVar4,"external"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "external";
        pcVar4 = "";
      }
      else if ((pcVar4 == "operator") || (iVar3 = strcmp(pcVar4,"operator"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "operator";
        pcVar4 = "";
      }
      else if ((pcVar4 == "processor") || (iVar3 = strcmp(pcVar4,"processor"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "processor";
        pcVar4 = "";
      }
      else if ((pcVar4 == "namespace") || (iVar3 = strcmp(pcVar4,"namespace"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "namespace";
        pcVar4 = "";
      }
      else if ((pcVar4 == "complex32") || (iVar3 = strcmp(pcVar4,"complex32"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "complex32";
        pcVar4 = "";
      }
      else if ((pcVar4 == "complex64") || (iVar3 = strcmp(pcVar4,"complex64"), iVar3 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "complex64";
        pcVar4 = "";
      }
      else {
        if ((pcVar4 != "connection") && (iVar3 = strcmp(pcVar4,"connection"), iVar3 != 0)) {
LAB_001ddae7:
          Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259dc6);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "connection";
        pcVar4 = "";
      }
      goto LAB_001ddff4;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "do";
    pcVar4 = "";
  }
LAB_001ddff4:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string parseAnnotationKey()
    {
        if (matchesAny (Token::identifier, Token::literalString))
            return currentStringValue;

        #define SOUL_CHECK_KEYWORD(name, str) if (matches (Keyword::name)) return str;
        SOUL_KEYWORDS (SOUL_CHECK_KEYWORD)
        #undef SOUL_CHECK_KEYWORD

        expect (Token::identifier);
        return {};
    }